

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O1

TopLevelEvalFunctionBodyResolveInfo * __thiscall
TTD::UnorderedArrayList<TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo,_128UL>::
NextOpenEntry(UnorderedArrayList<TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo,_128UL>
              *this)

{
  TopLevelEvalFunctionBodyResolveInfo *pTVar1;
  TopLevelEvalFunctionBodyResolveInfo *pTVar2;
  
  pTVar1 = (this->m_inlineHeadBlock).CurrPos;
  pTVar2 = (this->m_inlineHeadBlock).EndPos;
  if ((pTVar1 <= pTVar2) &&
     ((ulong)((long)pTVar1 - (long)(this->m_inlineHeadBlock).BlockData) < 0x4080)) {
    if (pTVar1 == pTVar2) {
      AddArrayLink(this);
    }
    pTVar1 = (this->m_inlineHeadBlock).CurrPos;
    (this->m_inlineHeadBlock).CurrPos = pTVar1 + 1;
    return pTVar1;
  }
  TTDAbort_unrecoverable_error("We are off the end of the array");
}

Assistant:

T* NextOpenEntry()
        {
            TTDAssert(this->m_inlineHeadBlock.CurrPos <= this->m_inlineHeadBlock.EndPos, "We are off the end of the array");
            TTDAssert((((byte*)this->m_inlineHeadBlock.CurrPos) - ((byte*)this->m_inlineHeadBlock.BlockData)) / sizeof(T) <= allocSize, "We are off the end of the array");

            if (this->m_inlineHeadBlock.CurrPos == this->m_inlineHeadBlock.EndPos)
            {
                this->AddArrayLink();
            }

            T* entry = this->m_inlineHeadBlock.CurrPos;
            this->m_inlineHeadBlock.CurrPos++;

            return entry;
        }